

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::RandomUniformLikeLayerParams::Clear(RandomUniformLikeLayerParams *this)

{
  uint32_t cached_has_bits;
  RandomUniformLikeLayerParams *this_local;
  
  memset(&this->seed_,0,0x10);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void RandomUniformLikeLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.RandomUniformLikeLayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  ::memset(&seed_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&maxval_) -
      reinterpret_cast<char*>(&seed_)) + sizeof(maxval_));
  _internal_metadata_.Clear<std::string>();
}